

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void undefgoto(LexState *ls,Labeldesc *gt)

{
  TString *pTVar1;
  TString *pTVar2;
  char *msg;
  
  pTVar1 = gt->name;
  pTVar2 = luaS_newlstr(ls->L,"break",5);
  if (pTVar1 == pTVar2) {
    msg = luaO_pushfstring(ls->L,"break outside loop at line %d",(ulong)(uint)gt->line);
  }
  else {
    msg = luaO_pushfstring(ls->L,"no visible label \'%s\' for <goto> at line %d",gt->name->contents,
                           (ulong)(uint)gt->line);
  }
  luaK_semerror(ls,msg);
}

Assistant:

static l_noret undefgoto (LexState *ls, Labeldesc *gt) {
  const char *msg;
  if (eqstr(gt->name, luaS_newliteral(ls->L, "break"))) {
    msg = "break outside loop at line %d";
    msg = luaO_pushfstring(ls->L, msg, gt->line);
  }
  else {
    msg = "no visible label '%s' for <goto> at line %d";
    msg = luaO_pushfstring(ls->L, msg, getstr(gt->name), gt->line);
  }
  luaK_semerror(ls, msg);
}